

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathParserContextPtr xmlXPathNewParserContext(xmlChar *str,xmlXPathContextPtr ctxt)

{
  xmlDictPtr dict;
  xmlXPathParserContextPtr pxVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathStepOp *__s;
  
  pxVar1 = (xmlXPathParserContextPtr)(*xmlMalloc)(0x58);
  if (pxVar1 == (xmlXPathParserContextPtr)0x0) {
    xmlXPathErrMemory(ctxt);
  }
  else {
    *(undefined8 *)&pxVar1->error = 0;
    pxVar1->context = (xmlXPathContextPtr)0x0;
    *(undefined8 *)&pxVar1->xptr = 0;
    pxVar1->ancestor = (xmlNodePtr)0x0;
    pxVar1->valueTab = (xmlXPathObjectPtr *)0x0;
    pxVar1->comp = (xmlXPathCompExprPtr)0x0;
    *(undefined8 *)&pxVar1->valueFrame = 0;
    pxVar1->value = (xmlXPathObjectPtr)0x0;
    pxVar1->valueNr = 0;
    pxVar1->valueMax = 0;
    pxVar1->base = str;
    pxVar1->cur = str;
    pxVar1->context = ctxt;
    pxVar2 = (xmlXPathCompExprPtr)(*xmlMalloc)(0x28);
    if (pxVar2 != (xmlXPathCompExprPtr)0x0) {
      pxVar2->expr = (xmlChar *)0x0;
      pxVar2->dict = (xmlDictPtr)0x0;
      pxVar2->steps = (xmlXPathStepOp *)0x0;
      *(undefined8 *)&pxVar2->last = 0;
      pxVar2->nbStep = 0;
      pxVar2->maxStep = 10;
      __s = (xmlXPathStepOp *)(*xmlMalloc)(0x230);
      pxVar2->steps = __s;
      if (__s != (xmlXPathStepOp *)0x0) {
        memset(__s,0,(long)pxVar2->maxStep * 0x38);
        pxVar2->last = -1;
        pxVar1->comp = pxVar2;
        if (ctxt == (xmlXPathContextPtr)0x0) {
          return pxVar1;
        }
        dict = ctxt->dict;
        if (dict == (xmlDictPtr)0x0) {
          return pxVar1;
        }
        pxVar2->dict = dict;
        xmlDictReference(dict);
        return pxVar1;
      }
      (*xmlFree)(pxVar2);
    }
    pxVar1->comp = (xmlXPathCompExprPtr)0x0;
    xmlXPathErrMemory(ctxt);
    (*xmlFree)(pxVar1->valueTab);
    (*xmlFree)(pxVar1);
  }
  return (xmlXPathParserContextPtr)0x0;
}

Assistant:

xmlXPathParserContextPtr
xmlXPathNewParserContext(const xmlChar *str, xmlXPathContextPtr ctxt) {
    xmlXPathParserContextPtr ret;

    ret = (xmlXPathParserContextPtr) xmlMalloc(sizeof(xmlXPathParserContext));
    if (ret == NULL) {
        xmlXPathErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0 , sizeof(xmlXPathParserContext));
    ret->cur = ret->base = str;
    ret->context = ctxt;

    ret->comp = xmlXPathNewCompExpr();
    if (ret->comp == NULL) {
        xmlXPathErrMemory(ctxt);
	xmlFree(ret->valueTab);
	xmlFree(ret);
	return(NULL);
    }
    if ((ctxt != NULL) && (ctxt->dict != NULL)) {
        ret->comp->dict = ctxt->dict;
	xmlDictReference(ret->comp->dict);
    }

    return(ret);
}